

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

void predict_or_learn<false,false,false,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint64_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  ostream *poVar8;
  uint64_t uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  features *this;
  uint64_t uVar13;
  polyprediction *ppVar14;
  float fVar15;
  stringstream outputStringStream;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  uVar3 = (ec->l).multi.label;
  fVar1 = (ec->l).simple.weight;
  if (((ulong)uVar3 == 0) || ((uVar3 != 0xffffffff && (o->k < (ulong)uVar3)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," is not in {1,",0xe);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar4 = o->k;
  ppVar14 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    if (uVar4 == 0) {
      uVar9 = (ec->super_example_predict).ft_offset;
    }
    else {
      uVar13 = uVar4;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar15 = (ec->pred).scalar;
        fVar2 = *(float *)((long)&ec->pred + 4);
        uVar5 = *(undefined4 *)((long)&ec->pred + 8);
        uVar6 = *(undefined4 *)((long)&ec->pred + 0xc);
        sVar7 = (ec->pred).scalars.erase_count;
        (ppVar14->scalars).end_array = (ec->pred).scalars.end_array;
        (ppVar14->scalars).erase_count = sVar7;
        ppVar14->scalar = fVar15;
        *(float *)((long)&(ppVar14->scalars)._begin + 4) = fVar2;
        *(undefined4 *)&(ppVar14->scalars)._end = uVar5;
        *(undefined4 *)((long)&(ppVar14->scalars)._end + 4) = uVar6;
        uVar9 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar9;
        ppVar14 = ppVar14 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    uVar9 = uVar9 - (uint)((int)uVar4 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar4,
               *(undefined8 *)(base + 0xe0),ppVar14,1);
    uVar9 = (ec->super_example_predict).ft_offset;
  }
  (ec->super_example_predict).ft_offset = uVar9;
  uVar10 = o->k;
  fVar15 = 1.4013e-45;
  if (1 < uVar10) {
    fVar15 = 1.4013e-45;
    uVar11 = 3;
    do {
      fVar2 = o->pred[uVar11 - 2].scalar;
      ppVar14 = o->pred + ((int)fVar15 - 1);
      if (ppVar14->scalar <= fVar2 && fVar2 != ppVar14->scalar) {
        fVar15 = (float)(uVar11 - 1);
      }
      uVar12 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar12 <= uVar10);
  }
  this = ec->passthrough;
  if (uVar10 != 0 && this != (features *)0x0) {
    uVar12 = 1;
    uVar11 = 2;
    while( true ) {
      if (this != (features *)0x0) {
        features::push_back(this,o->pred[uVar11 - 2].scalar,uVar12 ^ 0x398d9fda640553);
        uVar10 = o->k;
      }
      uVar12 = (ulong)uVar11;
      if (uVar10 < uVar12) break;
      this = ec->passthrough;
      uVar11 = uVar11 + 1;
    }
  }
  (ec->pred).scalar = fVar15;
  (ec->l).multi.label = uVar3;
  (ec->l).simple.weight = fVar1;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}